

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

void __thiscall despot::PocmanPOMCPPrior::ComputePreference(PocmanPOMCPPrior *this,State *state)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint local_44;
  uint local_40;
  int local_3c;
  State *local_38;
  
  if (*(long *)&this->field_0x68 != *(long *)&this->field_0x60) {
    *(long *)&this->field_0x68 = *(long *)&this->field_0x60;
  }
  if (*(long *)&this->field_0x50 != *(long *)&this->field_0x48) {
    *(long *)&this->field_0x50 = *(long *)&this->field_0x48;
  }
  local_38 = state;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    uVar3 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),local_3c);
    if ((uVar3 & 0x8000000080000000) == 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&this->field_0x60,&local_3c);
    }
  }
  if (*(long *)&this->field_0x18 != *(long *)&this->field_0x10) {
    iVar1 = *(int *)(*(long *)&this->field_0x18 + -4);
    uVar3 = *(ulong *)(*(long *)&this->field_0x30 + -8);
    uVar4 = (uint)uVar3;
    if ((*(int *)(local_38 + 0x84) < 1) || ((uVar3 & 0xf) == 0)) {
      for (local_44 = 0; (int)local_44 < 4; local_44 = local_44 + 1) {
        uVar3 = Pocman::NextPos(this->pocman_,(Coord *)(state + 0x20),local_44);
        if (((uVar3 & 0x8000000080000000) == 0) && ((uVar4 >> (local_44 & 0x1f) & 1) == 0)) {
          iVar2 = despot::Compass::Opposite(local_44);
          if (iVar2 != iVar1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&this->field_0x48,
                       (value_type *)&local_44);
          }
        }
      }
    }
    else {
      for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
        if ((uVar4 >> (local_40 & 0x1f) & 1) != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&this->field_0x48,(value_type *)&local_40)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		const PocmanState& pocstate = static_cast<const PocmanState&>(state);
		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 4; a++) {
			Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
			if (newpos.x >= 0 && newpos.y >= 0)
				legal_actions_.push_back(a);
		}

		if (history_.Size()) {
			ACT_TYPE action = history_.LastAction();
			OBS_TYPE observation = history_.LastObservation();

			// If power pill and can see a ghost then chase it
			if (pocstate.power_steps > 0 && ((observation & 15) != 0)) {
				for (int a = 0; a < 4; a++)
					if (CheckFlag(observation, a))
						preferred_actions_.push_back(a);
			} else { // Otherwise avoid observed ghosts and avoid changing directions
				for (int a = 0; a < 4; a++) {
					Coord newpos = pocman_->NextPos(pocstate.pocman_pos, a);
					if (newpos.x >= 0 && newpos.y >= 0
						&& !CheckFlag(observation, a)
						&& Compass::Opposite(a) != action)
						preferred_actions_.push_back(a);
				}
			}
		}
	}